

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall
ChainstateManager::ReceivedBlockTransactions
          (ChainstateManager *this,CBlock *block,CBlockIndex *pindexNew,FlatFilePos *pos)

{
  int *flag;
  multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  *this_00;
  uint uVar1;
  int iVar2;
  long lVar3;
  pointer ppCVar4;
  ulong uVar5;
  CBlockIndex *pCVar6;
  uint64_t uVar7;
  _Base_ptr p_Var8;
  char (*args_3) [13];
  _Self __tmp;
  _Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> __position;
  pointer ppCVar9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  pair<std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  pVar10;
  unsigned_long *puVar11;
  char (*in_stack_ffffffffffffff40) [13];
  CBlockIndex *pindex;
  CBlockIndex *pindexNew_local;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_a8;
  deque<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> queue;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (ulong)((long)(block->vtx).
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(block->vtx).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  pindexNew->nTx = (uint)uVar5;
  pindexNew_local = pindexNew;
  if (pindexNew->m_chain_tx_count != 0) {
    if (pindexNew->pprev == (CBlockIndex *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = pindexNew->pprev->m_chain_tx_count;
    }
    if (pindexNew->m_chain_tx_count != (uVar5 & 0xffffffff) + uVar7) {
      if (this->m_active_chainstate == (Chainstate *)0x0) {
        pCVar6 = (CBlockIndex *)0x0;
      }
      else {
        pCVar6 = Chainstate::SnapshotBase(this->m_active_chainstate);
      }
      if (pCVar6 != pindexNew) {
        flag = &pindexNew_local->nHeight;
        iVar2 = (int)pindexNew_local;
        if (pindexNew_local->pprev == (CBlockIndex *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = pindexNew_local->pprev->m_chain_tx_count;
        }
        local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(uVar7 + pindexNew_local->nTx);
        puVar11 = (unsigned_long *)0xb10b4b;
        FormatFullVersion_abi_cxx11_();
        logging_function._M_str = "ReceivedBlockTransactions";
        logging_function._M_len = 0x19;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x57;
        LogPrintf_<int,unsigned_long,unsigned_long,char[13],std::__cxx11::string,char[42]>
                  (logging_function,source_file,0xf13,(LogFlags)flag,iVar2 + 0x50,(char *)&local_a8,
                   (int *)&queue,puVar11,(unsigned_long *)this,in_stack_ffffffffffffff40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pindex,
                   (char (*) [42])pindexNew_local);
        if ((iterator *)
            queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Deque_impl_data._M_map !=
            &queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Deque_impl_data._M_start) {
          operator_delete(queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                          _M_impl.super__Deque_impl_data._M_map,
                          (long)queue.
                                super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_cur + 1);
        }
        pindexNew_local->m_chain_tx_count = 0;
      }
    }
  }
  uVar1 = pos->nPos;
  pindexNew_local->nFile = pos->nFile;
  pindexNew_local->nDataPos = uVar1;
  pindexNew_local->nUndoPos = 0;
  uVar1 = pindexNew_local->nStatus;
  pindexNew_local->nStatus = uVar1 | 8;
  if ((((this->m_options).chainparams)->consensus).SegwitHeight <= pindexNew_local->nHeight) {
    pindexNew_local->nStatus = uVar1 | 0x88;
  }
  uVar1 = pindexNew_local->nStatus;
  if ((uVar1 & 7) < 3 && (uVar1 & 0x60) == 0) {
    pindexNew_local->nStatus = uVar1 & 0xffffff98 | 3;
  }
  std::
  _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
  ::_M_insert_unique<CBlockIndex*const&>
            ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
              *)&(this->m_blockman).m_dirty_blockindex,&pindexNew_local);
  pCVar6 = pindexNew_local->pprev;
  if ((pCVar6 == (CBlockIndex *)0x0) || (pCVar6->m_chain_tx_count != 0)) {
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::_M_initialize_map
              (&queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>,0);
    if (queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<CBlockIndex*,std::allocator<CBlockIndex*>>::_M_push_back_aux<CBlockIndex*const&>
                ((deque<CBlockIndex*,std::allocator<CBlockIndex*>> *)&queue,&pindexNew_local);
    }
    else {
      *queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = pindexNew_local;
      queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 1;
    }
    if (queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      this_00 = &(this->m_blockman).m_blocks_unlinked;
      do {
        pindex = *queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        if (queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur ==
            queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur =
               queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node[1];
          queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_last =
               queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur + 0x40;
          queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_first =
               queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
          queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_node =
               queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur =
               queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur + 1;
        }
        pCVar6 = pindex;
        if (pindex->m_chain_tx_count != 0) {
          if (pindex->pprev == (CBlockIndex *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = pindex->pprev->m_chain_tx_count;
          }
          if (pindex->m_chain_tx_count != pindex->nTx + uVar7) {
            if (pindex->pprev == (CBlockIndex *)0x0) {
              uVar7 = 0;
            }
            else {
              uVar7 = pindex->pprev->m_chain_tx_count;
            }
            args_3 = (char (*) [13])(pindex->nTx + uVar7);
            puVar11 = (unsigned_long *)0xb10d5d;
            FormatFullVersion_abi_cxx11_();
            logging_function_00._M_str = "ReceivedBlockTransactions";
            logging_function_00._M_len = 0x19;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file_00._M_len = 0x57;
            LogPrintf_<int,unsigned_long,unsigned_long,char[13],std::__cxx11::string,char[42]>
                      (logging_function_00,source_file_00,0xf2f,(LogFlags)&pCVar6->nHeight,
                       (int)pCVar6 + 0x50,&stack0xffffffffffffff40,(int *)&local_a8,puVar11,
                       (unsigned_long *)this,args_3,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pindex,
                       (char (*) [42])pindexNew_local);
            if (local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(local_a8.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8.
                                    super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
          }
        }
        if (pindex->pprev == (CBlockIndex *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = pindex->pprev->m_chain_tx_count;
        }
        pindex->m_chain_tx_count = pindex->nTx + uVar7;
        iVar2 = this->nBlockSequenceId;
        this->nBlockSequenceId = iVar2 + 1;
        pindex->nSequenceId = iVar2;
        GetAll(&local_a8,this);
        ppCVar4 = local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppCVar9 = local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_start; ppCVar9 != ppCVar4;
            ppCVar9 = ppCVar9 + 1) {
          Chainstate::TryAddBlockIndexCandidate(*ppCVar9,pindex);
        }
        if (local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_a8.
                                super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.
                                super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pVar10 = std::
                 _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                 ::equal_range(&this_00->_M_t,&pindex);
        __position._M_node = pVar10.first._M_node._M_node;
        while (__position._M_node != pVar10.second._M_node._M_node) {
          if (queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<CBlockIndex*,std::allocator<CBlockIndex*>>::
            _M_push_back_aux<CBlockIndex*const&>
                      ((deque<CBlockIndex*,std::allocator<CBlockIndex*>> *)&queue,
                       (CBlockIndex **)&__position._M_node[1]._M_parent);
          }
          else {
            *queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur =
                 (CBlockIndex *)__position._M_node[1]._M_parent;
            queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur =
                 queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur + 1;
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
          ::erase_abi_cxx11_((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                              *)this_00,(iterator)__position._M_node);
          __position._M_node = p_Var8;
        }
      } while (queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur);
    }
    std::_Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Deque_base
              (&queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>);
  }
  else if ((pCVar6->nStatus & 6) != 0 && (pCVar6->nStatus & 0x60) == 0) {
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)pindexNew_local->pprev;
    queue.super__Deque_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Deque_impl_data._M_map_size = (size_t)pindexNew_local;
    std::
    _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
    ::_M_emplace_equal<std::pair<CBlockIndex*,CBlockIndex*>>
              ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                *)&(this->m_blockman).m_blocks_unlinked,(pair<CBlockIndex_*,_CBlockIndex_*> *)&queue
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChainstateManager::ReceivedBlockTransactions(const CBlock& block, CBlockIndex* pindexNew, const FlatFilePos& pos)
{
    AssertLockHeld(cs_main);
    pindexNew->nTx = block.vtx.size();
    // Typically m_chain_tx_count will be 0 at this point, but it can be nonzero if this
    // is a pruned block which is being downloaded again, or if this is an
    // assumeutxo snapshot block which has a hardcoded m_chain_tx_count value from the
    // snapshot metadata. If the pindex is not the snapshot block and the
    // m_chain_tx_count value is not zero, assert that value is actually correct.
    auto prev_tx_sum = [](CBlockIndex& block) { return block.nTx + (block.pprev ? block.pprev->m_chain_tx_count : 0); };
    if (!Assume(pindexNew->m_chain_tx_count == 0 || pindexNew->m_chain_tx_count == prev_tx_sum(*pindexNew) ||
                pindexNew == GetSnapshotBaseBlock())) {
        LogWarning("Internal bug detected: block %d has unexpected m_chain_tx_count %i that should be %i (%s %s). Please report this issue here: %s\n",
            pindexNew->nHeight, pindexNew->m_chain_tx_count, prev_tx_sum(*pindexNew), PACKAGE_NAME, FormatFullVersion(), PACKAGE_BUGREPORT);
        pindexNew->m_chain_tx_count = 0;
    }
    pindexNew->nFile = pos.nFile;
    pindexNew->nDataPos = pos.nPos;
    pindexNew->nUndoPos = 0;
    pindexNew->nStatus |= BLOCK_HAVE_DATA;
    if (DeploymentActiveAt(*pindexNew, *this, Consensus::DEPLOYMENT_SEGWIT)) {
        pindexNew->nStatus |= BLOCK_OPT_WITNESS;
    }
    pindexNew->RaiseValidity(BLOCK_VALID_TRANSACTIONS);
    m_blockman.m_dirty_blockindex.insert(pindexNew);

    if (pindexNew->pprev == nullptr || pindexNew->pprev->HaveNumChainTxs()) {
        // If pindexNew is the genesis block or all parents are BLOCK_VALID_TRANSACTIONS.
        std::deque<CBlockIndex*> queue;
        queue.push_back(pindexNew);

        // Recursively process any descendant blocks that now may be eligible to be connected.
        while (!queue.empty()) {
            CBlockIndex *pindex = queue.front();
            queue.pop_front();
            // Before setting m_chain_tx_count, assert that it is 0 or already set to
            // the correct value. This assert will fail after receiving the
            // assumeutxo snapshot block if assumeutxo snapshot metadata has an
            // incorrect hardcoded AssumeutxoData::m_chain_tx_count value.
            if (!Assume(pindex->m_chain_tx_count == 0 || pindex->m_chain_tx_count == prev_tx_sum(*pindex))) {
                LogWarning("Internal bug detected: block %d has unexpected m_chain_tx_count %i that should be %i (%s %s). Please report this issue here: %s\n",
                   pindex->nHeight, pindex->m_chain_tx_count, prev_tx_sum(*pindex), PACKAGE_NAME, FormatFullVersion(), PACKAGE_BUGREPORT);
            }
            pindex->m_chain_tx_count = prev_tx_sum(*pindex);
            pindex->nSequenceId = nBlockSequenceId++;
            for (Chainstate *c : GetAll()) {
                c->TryAddBlockIndexCandidate(pindex);
            }
            std::pair<std::multimap<CBlockIndex*, CBlockIndex*>::iterator, std::multimap<CBlockIndex*, CBlockIndex*>::iterator> range = m_blockman.m_blocks_unlinked.equal_range(pindex);
            while (range.first != range.second) {
                std::multimap<CBlockIndex*, CBlockIndex*>::iterator it = range.first;
                queue.push_back(it->second);
                range.first++;
                m_blockman.m_blocks_unlinked.erase(it);
            }
        }
    } else {
        if (pindexNew->pprev && pindexNew->pprev->IsValid(BLOCK_VALID_TREE)) {
            m_blockman.m_blocks_unlinked.insert(std::make_pair(pindexNew->pprev, pindexNew));
        }
    }
}